

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

void demo_prepare(demo *demo)

{
  VkResult VVar1;
  undefined1 local_50 [8];
  VkCommandBufferAllocateInfo cmd;
  VkCommandPoolCreateInfo cmd_pool_info;
  VkResult err;
  demo *demo_local;
  
  cmd.level = 0x27;
  VVar1 = (*glad_vkCreateCommandPool)
                    (demo->device,(VkCommandPoolCreateInfo *)&cmd.level,(VkAllocationCallbacks *)0x0
                     ,&demo->cmd_pool);
  if (VVar1 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                  ,0x60c,"void demo_prepare(struct demo *)");
  }
  local_50._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmd.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmd._4_4_ = 0;
  cmd.pNext = demo->cmd_pool;
  cmd.commandPool._0_4_ = 0;
  cmd.commandPool._4_4_ = 1;
  VVar1 = (*glad_vkAllocateCommandBuffers)
                    (demo->device,(VkCommandBufferAllocateInfo *)local_50,&demo->draw_cmd);
  if (VVar1 == VK_SUCCESS) {
    demo_prepare_buffers(demo);
    demo_prepare_depth(demo);
    demo_prepare_textures(demo);
    demo_prepare_vertices(demo);
    demo_prepare_descriptor_layout(demo);
    demo_prepare_render_pass(demo);
    demo_prepare_pipeline(demo);
    demo_prepare_descriptor_pool(demo);
    demo_prepare_descriptor_set(demo);
    demo_prepare_framebuffers(demo);
    return;
  }
  __assert_fail("!err",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/tests/triangle-vulkan.c"
                ,0x616,"void demo_prepare(struct demo *)");
}

Assistant:

static void demo_prepare(struct demo *demo) {
    VkResult U_ASSERT_ONLY err;

    const VkCommandPoolCreateInfo cmd_pool_info = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
        .pNext = NULL,
        .queueFamilyIndex = demo->graphics_queue_node_index,
        .flags = VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,
    };
    err = vkCreateCommandPool(demo->device, &cmd_pool_info, NULL,
                              &demo->cmd_pool);
    assert(!err);

    const VkCommandBufferAllocateInfo cmd = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
        .pNext = NULL,
        .commandPool = demo->cmd_pool,
        .level = VK_COMMAND_BUFFER_LEVEL_PRIMARY,
        .commandBufferCount = 1,
    };
    err = vkAllocateCommandBuffers(demo->device, &cmd, &demo->draw_cmd);
    assert(!err);

    demo_prepare_buffers(demo);
    demo_prepare_depth(demo);
    demo_prepare_textures(demo);
    demo_prepare_vertices(demo);
    demo_prepare_descriptor_layout(demo);
    demo_prepare_render_pass(demo);
    demo_prepare_pipeline(demo);

    demo_prepare_descriptor_pool(demo);
    demo_prepare_descriptor_set(demo);

    demo_prepare_framebuffers(demo);
}